

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_arg * __thiscall
fmt::v6::internal::
get_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
          (format_arg *__return_storage_ptr__,internal *this,
          basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
          *ctx,int id)

{
  long lVar1;
  longlong lVar2;
  size_t sVar3;
  type tVar4;
  format_arg *this_00;
  
  this_00 = __return_storage_ptr__;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  ::do_get(__return_storage_ptr__,
           (basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
            *)(this + 8),(int)ctx);
  tVar4 = __return_storage_ptr__->type_;
  if (tVar4 == named_arg_type) {
    lVar1 = (__return_storage_ptr__->value_).field_0.long_long_value;
    lVar2 = *(longlong *)(lVar1 + 0x10);
    sVar3 = *(size_t *)(lVar1 + 0x18);
    tVar4 = *(type *)(lVar1 + 0x20);
    __return_storage_ptr__->type_ = tVar4;
    (__return_storage_ptr__->value_).field_0.long_long_value = lVar2;
    (__return_storage_ptr__->value_).field_0.string.size = sVar3;
  }
  if (tVar4 != none_type) {
    return __return_storage_ptr__;
  }
  error_handler::on_error((error_handler *)this_00,"argument index out of range");
}

Assistant:

FMT_CONSTEXPR typename Context::format_arg get_arg(Context& ctx, int id) {
  auto arg = ctx.arg(id);
  if (!arg) ctx.on_error("argument index out of range");
  return arg;
}